

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeDouble(ParserImpl *this,double *value)

{
  size_type *psVar1;
  TokenType TVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  pointer pcVar6;
  double dVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string text;
  
  psVar1 = &text._M_string_length;
  local_50 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"-","");
  bVar3 = TryConsume(this,(string *)local_50);
  if (local_50 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_50);
  }
  TVar2 = (this->tokenizer_).current_.type;
  if (TVar2 == TYPE_IDENTIFIER) {
    pcVar6 = (this->tokenizer_).current_.text._M_dataplus._M_p;
    local_50 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar6,pcVar6 + (this->tokenizer_).current_.text._M_string_length)
    ;
    if (text._M_dataplus._M_p != (pointer)0x0) {
      pcVar6 = (pointer)0x0;
      do {
        if ((byte)(*(byte *)((long)local_50 + (long)pcVar6) + 0xbf) < 0x1a) {
          *(byte *)((long)local_50 + (long)pcVar6) = *(byte *)((long)local_50 + (long)pcVar6) | 0x20
          ;
        }
        pcVar6 = pcVar6 + 1;
      } while (text._M_dataplus._M_p != pcVar6);
    }
    iVar5 = std::__cxx11::string::compare(local_50);
    dVar7 = INFINITY;
    if (iVar5 != 0) {
      iVar5 = std::__cxx11::string::compare(local_50);
      dVar7 = INFINITY;
      if (iVar5 != 0) {
        iVar5 = std::__cxx11::string::compare(local_50);
        if (iVar5 != 0) {
          std::operator+(&local_70,"Expected double, got: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50);
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      &local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          goto LAB_002ff515;
        }
        dVar7 = NAN;
      }
    }
    *value = dVar7;
    io::Tokenizer::Next(&this->tokenizer_);
    if (local_50 != (undefined1  [8])&text._M_string_length) {
      operator_delete((void *)local_50);
    }
  }
  else {
    if (TVar2 == TYPE_INTEGER) {
      bVar4 = ConsumeUnsignedDecimalAsDouble(this,value,0xffffffffffffffff);
      if (!bVar3 || !bVar4) {
        return bVar4;
      }
      goto LAB_002ff556;
    }
    if (TVar2 != TYPE_FLOAT) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     "Expected double, got: ",&(this->tokenizer_).current_.text);
      ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
LAB_002ff515:
      if (local_50 != (undefined1  [8])&text._M_string_length) {
        operator_delete((void *)local_50);
      }
      return false;
    }
    dVar7 = io::Tokenizer::ParseFloat(&(this->tokenizer_).current_.text);
    *value = dVar7;
    io::Tokenizer::Next(&this->tokenizer_);
  }
  if (!bVar3) {
    return true;
  }
LAB_002ff556:
  *value = -*value;
  return true;
}

Assistant:

bool ConsumeDouble(double* value) {
    bool negative = false;

    if (TryConsume("-")) {
      negative = true;
    }

    // A double can actually be an integer, according to the tokenizer.
    // Therefore, we must check both cases here.
    if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      // We have found an integer value for the double.
      DO(ConsumeUnsignedDecimalAsDouble(value, kuint64max));
    } else if (LookingAtType(io::Tokenizer::TYPE_FLOAT)) {
      // We have found a float value for the double.
      *value = io::Tokenizer::ParseFloat(tokenizer_.current().text);

      // Mark the current token as consumed.
      tokenizer_.Next();
    } else if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      LowerString(&text);
      if (text == "inf" ||
          text == "infinity") {
        *value = std::numeric_limits<double>::infinity();
        tokenizer_.Next();
      } else if (text == "nan") {
        *value = std::numeric_limits<double>::quiet_NaN();
        tokenizer_.Next();
      } else {
        ReportError("Expected double, got: " + text);
        return false;
      }
    } else {
      ReportError("Expected double, got: " + tokenizer_.current().text);
      return false;
    }

    if (negative) {
      *value = -*value;
    }

    return true;
  }